

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsMatchFullNameCompile_Test::
ValidationErrorTest_ExtensionDeclarationsMatchFullNameCompile_Test
          (ValidationErrorTest_ExtensionDeclarationsMatchFullNameCompile_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01880298;
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsMatchFullNameCompile) {
  BuildFile(R"pb(
    name: "foo.proto"
    package: "ext.test"
    message_type {
      name: "Foo"
      extension_range {
        start: 11
        end: 999
        options: {
          declaration: {
            number: 100
            full_name: ".ext.test.foo"
            type: ".ext.test.Bar"
          }
        }
      }
    }
    message_type { name: "Bar" }
    extension { extendee: "Foo" name: "foo" number: 100 type_name: "Bar" }
  )pb");
}